

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_data.cpp
# Opt level: O0

void __thiscall
YAML::detail::node_data::push_back(node_data *this,node *node,shared_memory_holder *param_3)

{
  undefined8 uVar1;
  long in_RDI;
  BadPushback *in_stack_00000020;
  value_type *in_stack_ffffffffffffffb8;
  node_data *in_stack_ffffffffffffffc0;
  
  if ((*(int *)(in_RDI + 0x10) == 0) || (*(int *)(in_RDI + 0x10) == 1)) {
    *(undefined4 *)(in_RDI + 0x10) = 3;
    reset_sequence(in_stack_ffffffffffffffc0);
  }
  if (*(int *)(in_RDI + 0x10) != 3) {
    uVar1 = __cxa_allocate_exception(0x40);
    BadPushback::BadPushback(in_stack_00000020);
    __cxa_throw(uVar1,&BadPushback::typeinfo,BadPushback::~BadPushback);
  }
  std::vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_>::push_back
            ((vector<YAML::detail::node_*,_std::allocator<YAML::detail::node_*>_> *)
             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void node_data::push_back(node& node,
                          const shared_memory_holder& /* pMemory */) {
  if (m_type == NodeType::Undefined || m_type == NodeType::Null) {
    m_type = NodeType::Sequence;
    reset_sequence();
  }

  if (m_type != NodeType::Sequence)
    throw BadPushback();

  m_sequence.push_back(&node);
}